

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void m_detach(monst *mtmp,permonst *mptr)

{
  int *piVar1;
  uint uVar2;
  
  uVar2 = *(uint *)&mtmp->field_0x60;
  if ((uVar2 >> 0x18 & 1) != 0) {
    m_unleash(mtmp,'\0');
    uVar2 = *(uint *)&mtmp->field_0x60;
  }
  *(uint *)&mtmp->field_0x60 = uVar2 & 0xff7fffff;
  mtmp->mhp = 0;
  relobj(mtmp,0,'\0');
  mtmp->dlevel->monsters[mtmp->mx][mtmp->my] = (monst *)0x0;
  del_light_source(mtmp->dlevel,1,mtmp);
  newsym((int)mtmp->mx,(int)mtmp->my);
  unstuck(mtmp);
  fill_pit(mtmp->dlevel,(int)mtmp->mx,(int)mtmp->my);
  if ((mtmp->field_0x63 & 2) != 0) {
    shkgone(mtmp);
  }
  if (mtmp->wormno != '\0') {
    wormgone(mtmp);
  }
  piVar1 = &(mtmp->dlevel->flags).purge_monsters;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

static void m_detach(struct monst *mtmp, 
		     const struct permonst *mptr) /* reflects mtmp->data _prior_ to mtmp's death */
{
	if (mtmp->mleashed) m_unleash(mtmp, FALSE);
	    /* to prevent an infinite relobj-flooreffects-hmon-killed loop */
	mtmp->mtrapped = 0;
	mtmp->mhp = 0; /* simplify some tests: force mhp to 0 */
	relobj(mtmp, 0, FALSE);
	mtmp->dlevel->monsters[mtmp->mx][mtmp->my] = NULL;
	del_light_source(mtmp->dlevel, LS_MONSTER, mtmp);
	newsym(mtmp->mx,mtmp->my);
	unstuck(mtmp);
	fill_pit(mtmp->dlevel, mtmp->mx, mtmp->my);

	if (mtmp->isshk) shkgone(mtmp);
	if (mtmp->wormno) wormgone(mtmp);
	mtmp->dlevel->flags.purge_monsters++;
}